

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_metrics.c
# Opt level: O2

void ares_metrics_record(ares_query_t *query,ares_server_t *server,ares_status_t status,
                        ares_dns_record_t *dnsrec)

{
  ares_dns_rcode_t aVar1;
  ares_server_metrics_t *paVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  ares_timeval_t now;
  ares_timeval_t tvdiff;
  
  if (server != (ares_server_t *)0x0 && status == ARES_SUCCESS) {
    ares_tvnow(&now);
    aVar1 = ares_dns_record_get_rcode(dnsrec);
    if ((aVar1 == ARES_RCODE_NXDOMAIN) || (aVar1 == ARES_RCODE_NOERROR)) {
      ares_timeval_diff(&tvdiff,&query->ts,&now);
      iVar4 = (int)tvdiff.sec * 1000 + tvdiff.usec / 1000;
      uVar5 = iVar4 + (uint)(iVar4 == 0);
      paVar2 = server->metrics;
      for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
        if (now.sec / 0x3c == paVar2->ts) {
          if (uVar5 <= paVar2->latency_min_ms - 1) goto LAB_0011232e;
        }
        else {
          paVar2->prev_ts = paVar2->ts;
          paVar2->prev_total_ms = paVar2->total_ms;
          paVar2->prev_total_count = paVar2->total_count;
          paVar2->ts = now.sec / 0x3c;
          paVar2->latency_min_ms = 0;
          paVar2->latency_max_ms = 0;
          paVar2->total_ms = 0;
          paVar2->total_count = 0;
LAB_0011232e:
          paVar2->latency_min_ms = uVar5;
        }
        if (paVar2->latency_max_ms < uVar5) {
          paVar2->latency_max_ms = uVar5;
        }
        paVar2->total_ms = paVar2->total_ms + (ulong)uVar5;
        paVar2->total_count = paVar2->total_count + 1;
        paVar2 = paVar2 + 1;
      }
    }
  }
  return;
}

Assistant:

void ares_metrics_record(const ares_query_t *query, ares_server_t *server,
                         ares_status_t status, const ares_dns_record_t *dnsrec)
{
  ares_timeval_t       now;
  ares_timeval_t       tvdiff;
  unsigned int         query_ms;
  ares_dns_rcode_t     rcode;
  ares_server_bucket_t i;

  if (status != ARES_SUCCESS) {
    return;
  }

  if (server == NULL) {
    return;
  }

  ares_tvnow(&now);

  rcode = ares_dns_record_get_rcode(dnsrec);
  if (rcode != ARES_RCODE_NOERROR && rcode != ARES_RCODE_NXDOMAIN) {
    return;
  }

  ares_timeval_diff(&tvdiff, &query->ts, &now);
  query_ms = (unsigned int)((tvdiff.sec * 1000) + (tvdiff.usec / 1000));
  if (query_ms == 0) {
    query_ms = 1;
  }

  /* Place in each bucket */
  for (i = 0; i < ARES_METRIC_COUNT; i++) {
    time_t ts = ares_metric_timestamp(i, &now, ARES_FALSE);

    /* Copy metrics to prev and clear */
    if (ts != server->metrics[i].ts) {
      server->metrics[i].prev_ts          = server->metrics[i].ts;
      server->metrics[i].prev_total_ms    = server->metrics[i].total_ms;
      server->metrics[i].prev_total_count = server->metrics[i].total_count;
      server->metrics[i].ts               = ts;
      server->metrics[i].latency_min_ms   = 0;
      server->metrics[i].latency_max_ms   = 0;
      server->metrics[i].total_ms         = 0;
      server->metrics[i].total_count      = 0;
    }

    if (server->metrics[i].latency_min_ms == 0 ||
        server->metrics[i].latency_min_ms > query_ms) {
      server->metrics[i].latency_min_ms = query_ms;
    }

    if (query_ms > server->metrics[i].latency_max_ms) {
      server->metrics[i].latency_max_ms = query_ms;
    }

    server->metrics[i].total_count++;
    server->metrics[i].total_ms += (ares_uint64_t)query_ms;
  }
}